

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_to_hex.h
# Opt level: O3

void __thiscall
fmt::v8::
formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>,_char,_void>
::put_newline<fmt::v8::appender>
          (formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>,_char,_void>
           *this,appender inserter,size_t pos)

{
  long lVar1;
  buffer<char> *buf;
  ulong uVar2;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args;
  size_t local_28 [2];
  
  lVar1 = *(long *)((long)inserter.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                          container + 0x10);
  uVar2 = lVar1 + 1;
  if (*(ulong *)((long)inserter.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                + 0x18) < uVar2) {
    (*(code *)**(undefined8 **)
                inserter.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
              (inserter.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    lVar1 = *(long *)((long)inserter.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                            container + 0x10);
    uVar2 = lVar1 + 1;
  }
  *(ulong *)((long)inserter.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
            0x10) = uVar2;
  *(undefined1 *)
   (*(long *)((long)inserter.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
             8) + lVar1) = 10;
  if (this->put_positions == true) {
    fmt.size_ = 8;
    fmt.data_ = "{:04X}: ";
    args.field_1.values_ =
         (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_28;
    args.desc_ = 4;
    local_28[0] = pos;
    detail::vformat_to<char>
              ((buffer<char> *)
               inserter.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,fmt,
               args,(locale_ref)0x0);
  }
  return;
}

Assistant:

void put_newline(It inserter, std::size_t pos)
    {
#ifdef _WIN32
        *inserter++ = '\r';
#endif
        *inserter++ = '\n';

        if (put_positions)
        {
            fmt::format_to(inserter, "{:04X}: ", pos);
        }
    }